

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O0

Vec_Str_t * Wlc_StdinCollectProblem(char *pDir)

{
  int iVar1;
  size_t sVar2;
  Vec_Str_t *p;
  Vec_Str_t *vInput;
  int DirSize;
  int c;
  char *pDir_local;
  
  sVar2 = strlen(pDir);
  p = Vec_StrAlloc(1000);
  do {
    iVar1 = fgetc(_stdin);
    if (iVar1 == -1) break;
    Vec_StrPush(p,(char)iVar1);
  } while ((iVar1 != 0x29) || (iVar1 = Wlc_StdinCollectStop(p,pDir,(int)sVar2), iVar1 == 0));
  Vec_StrPush(p,'\0');
  return p;
}

Assistant:

Vec_Str_t * Wlc_StdinCollectProblem( char * pDir )
{
    int c, DirSize = strlen(pDir);
    Vec_Str_t * vInput = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(stdin)) != EOF )
    {
        Vec_StrPush( vInput, (char)c );
        if ( c == ')' && Wlc_StdinCollectStop(vInput, pDir, DirSize) )
            break;
    }
    Vec_StrPush( vInput, '\0' );
    return vInput;
}